

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processTimingTick(CommonCore *this,ActionMessage *cmd)

{
  FederateState *this_00;
  string_view message;
  string_view message_00;
  FederateStates FVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  FedInfo **ppFVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  FedInfo **ppFVar9;
  FedInfo *pFVar10;
  FedInfo **ppFVar11;
  string_view name;
  string_view name_00;
  ActionMessage bye;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if ((((cmd->messageID & 3) != 0) && ((this->super_BrokerBase).brokerState._M_i == OPERATING)) &&
     (TimeoutMonitor::tick
                ((this->timeoutMon)._M_t.
                 super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                 .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl,this),
     5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i)) {
    message._M_str = " core tick";
    message._M_len = 10;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,name,message,
               false);
  }
  uVar2 = cmd->messageID;
  if ((uVar2 & 4) != 0) {
    checkQueryTimeouts(this);
    uVar2 = cmd->messageID;
  }
  if ((uVar2 & 0x10) != 0) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    lVar3 = lVar3 - (this->super_BrokerBase).disconnectTime.__d.__r;
    lVar7 = ((this->super_BrokerBase).tickTimer.internalTimeCode * 3) / 1000000;
    lVar4 = lVar7 * 1000000;
    if (lVar3 != lVar4 && SBORROW8(lVar3,lVar4) == lVar3 + lVar7 * -1000000 < 0) {
      message_00._M_str = " disconnect Timer expired forcing disconnect";
      message_00._M_len = 0x2c;
      name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name_00,
                 message_00,false);
      ActionMessage::ActionMessage(&local_e8,cmd_disconnect_fed_ack);
      local_e8.source_id.gid = 0;
      if ((this->loopFederates).dataStorage.csize == 0) {
        uVar2 = (this->loopFederates).dataStorage.bsize;
        ppFVar5 = (this->loopFederates).dataStorage.dataptr;
        if ((long)(int)uVar2 == 0x20) {
          lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
          if (ppFVar5 == (FedInfo **)0x0) {
            ppFVar11 = (FedInfo **)
                       &gmlc::containers::
                        StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()
                        ::emptyValue;
          }
          else {
            ppFVar11 = ppFVar5 + lVar7 + 1;
          }
          pFVar10 = *ppFVar11;
          uVar2 = 0;
          uVar6 = 0x20;
        }
        else {
          lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
          ppFVar11 = ppFVar5 + lVar7;
          pFVar10 = *ppFVar11 + (int)uVar2;
          uVar6 = uVar2;
        }
      }
      else {
        ppFVar5 = (this->loopFederates).dataStorage.dataptr;
        pFVar10 = *ppFVar5;
        lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
        ppFVar11 = ppFVar5;
        uVar2 = 0;
        uVar6 = (this->loopFederates).dataStorage.bsize;
      }
      if (ppFVar5 == (FedInfo **)0x0) {
        ppFVar9 = (FedInfo **)
                  &gmlc::containers::
                   StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                   emptyValue;
      }
      else {
        ppFVar9 = ppFVar5 + lVar7 + 1;
      }
      uVar8 = 0;
      if (uVar6 != 0x20) {
        ppFVar9 = ppFVar5 + lVar7;
        uVar8 = uVar6;
      }
      while ((uVar2 != uVar8 || (ppFVar11 != ppFVar9))) {
        this_00 = pFVar10->fed;
        FVar1 = FederateState::getState(this_00);
        if (FVar1 != FINISHED) {
          local_e8.dest_id.gid = (this_00->global_id)._M_i.gid;
          FederateState::addAction(this_00,&local_e8);
        }
        if ((int)uVar2 < 0x1f) {
          pFVar10 = pFVar10 + 1;
          uVar2 = uVar2 + 1;
        }
        else {
          ppFVar11 = ppFVar11 + (ulong)(uVar2 - 0x1f >> 5) + 1;
          uVar2 = uVar2 + 1 & 0x1f;
          pFVar10 = (FedInfo *)((long)&(*ppFVar11)->fed + (ulong)(uVar2 << 4));
        }
      }
      ActionMessage::ActionMessage(&local_1a0,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,&local_1a0);
      ActionMessage::~ActionMessage(&local_1a0);
      ActionMessage::~ActionMessage(&local_e8);
    }
  }
  return;
}

Assistant:

void CommonCore::processTimingTick(ActionMessage& cmd)
{
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::PING_RESPONSE) ||
        isReasonForTick(cmd.messageID, TickForwardingReasons::NO_COMMS)) {
        if (getBrokerState() == BrokerState::OPERATING) {
            timeoutMon->tick(this);
            LOG_SUMMARY(global_broker_id_local, getIdentifier(), " core tick");
        }
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::QUERY_TIMEOUT)) {
        checkQueryTimeouts();
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::DISCONNECT_TIMEOUT)) {
        auto now = std::chrono::steady_clock::now();
        if (now - disconnectTime > (3 * tickTimer).to_ms()) {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        " disconnect Timer expired forcing disconnect");
            ActionMessage bye(CMD_DISCONNECT_FED_ACK);
            bye.source_id = parent_broker_id;
            for (FedInfo fed : loopFederates) {
                if (fed->getState() != FederateStates::FINISHED) {
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                }
            }
            addActionMessage(CMD_STOP);
        }
    }
}